

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_maybe.cpp
# Opt level: O0

void __thiscall Maybe_AssignZero_Test::TestBody(Maybe_AssignZero_Test *this)

{
  maybe<char,_void> *pmVar1;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  AssertHelper local_1a8;
  Message local_1a0;
  int local_194;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_3;
  Message local_178;
  int local_16c;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_138;
  Message local_130;
  bool local_121;
  undefined1 local_120 [8];
  AssertionResult gtest_ar__2;
  maybe<char,_void> m2;
  Message local_100;
  int local_f4;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_1;
  Message local_d8;
  int local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_98;
  Message local_90;
  bool local_81;
  undefined1 local_80 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_50;
  Message local_48 [3];
  bool local_29;
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  maybe<char,_void> m;
  Maybe_AssignZero_Test *this_local;
  
  pmVar1 = (maybe<char,_void> *)
           ((long)&gtest_ar_.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 6);
  pstore::maybe<char,_void>::maybe(pmVar1);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_1_ = 0;
  pstore::maybe<char,void>::operator=
            ((maybe<char,void> *)pmVar1,
             (char *)((long)&gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 5));
  local_29 = pstore::maybe::operator_cast_to_bool((maybe *)pmVar1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_28,&local_29,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar2) {
    testing::Message::Message(local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_28,
               (AssertionResult *)"m.operator bool ()","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_maybe.cpp"
               ,0x80,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  local_81 = pstore::maybe<char,_void>::has_value
                       ((maybe<char,_void> *)
                        ((long)&gtest_ar_.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        + 6));
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_80,&local_81,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar2) {
    testing::Message::Message(&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_80,(AssertionResult *)"m.has_value ()"
               ,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_maybe.cpp"
               ,0x81,pcVar3);
    testing::internal::AssertHelper::operator=(&local_98,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  pcVar3 = pstore::maybe<char,_void>::value
                     ((maybe<char,_void> *)
                      ((long)&gtest_ar_.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      + 6));
  local_cc = 0;
  testing::internal::EqHelper::Compare<char,_int,_nullptr>
            ((EqHelper *)local_c8,"m.value ()","0",pcVar3,&local_cc);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar2) {
    testing::Message::Message(&local_d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_maybe.cpp"
               ,0x82,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  pcVar3 = pstore::maybe<char,_void>::operator*
                     ((maybe<char,_void> *)
                      ((long)&gtest_ar_.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      + 6));
  local_f4 = 0;
  testing::internal::EqHelper::Compare<char,_int,_nullptr>
            ((EqHelper *)local_f0,"*m","0",pcVar3,&local_f4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar2) {
    testing::Message::Message(&local_100);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffef8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_maybe.cpp"
               ,0x83,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffef8,&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffef8);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  pmVar1 = (maybe<char,_void> *)
           ((long)&gtest_ar__2.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 6);
  pstore::maybe<char,_void>::maybe
            (pmVar1,(maybe<char,_void> *)
                    ((long)&gtest_ar_.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 6));
  local_121 = pstore::maybe<char,_void>::has_value(pmVar1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_120,&local_121,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar2) {
    testing::Message::Message(&local_130);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2.message_,(internal *)local_120,
               (AssertionResult *)"m2.has_value ()","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_maybe.cpp"
               ,0x86,pcVar3);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  pcVar3 = pstore::maybe<char,_void>::value
                     ((maybe<char,_void> *)
                      ((long)&gtest_ar__2.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      + 6));
  local_16c = 0;
  testing::internal::EqHelper::Compare<char,_int,_nullptr>
            ((EqHelper *)local_168,"m2.value ()","0",pcVar3,&local_16c);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar2) {
    testing::Message::Message(&local_178);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_maybe.cpp"
               ,0x87,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  pcVar3 = pstore::maybe<char,_void>::operator*
                     ((maybe<char,_void> *)
                      ((long)&gtest_ar__2.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      + 6));
  local_194 = 0;
  testing::internal::EqHelper::Compare<char,_int,_nullptr>
            ((EqHelper *)local_190,"*m2","0",pcVar3,&local_194);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar2) {
    testing::Message::Message(&local_1a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_maybe.cpp"
               ,0x88,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  pstore::maybe<char,_void>::~maybe
            ((maybe<char,_void> *)
             ((long)&gtest_ar__2.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 6));
  pstore::maybe<char,_void>::~maybe
            ((maybe<char,_void> *)
             ((long)&gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 6));
  return;
}

Assistant:

TEST (Maybe, AssignZero) {
    maybe<char> m;
    m = char{0};
    EXPECT_TRUE (m.operator bool ());
    EXPECT_TRUE (m.has_value ());
    EXPECT_EQ (m.value (), 0);
    EXPECT_EQ (*m, 0);

    maybe<char> m2 = m;
    EXPECT_TRUE (m2.has_value ());
    EXPECT_EQ (m2.value (), 0);
    EXPECT_EQ (*m2, 0);
}